

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

size_t __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytes(SDES *this)

{
  ulong uVar1;
  size_t sVar2;
  _Self __tmp;
  _List_node_base *p_Var3;
  long lVar4;
  
  p_Var3 = (this->sdessources).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)&this->sdessources) {
    sVar2 = 0;
  }
  else {
    lVar4 = 0;
    for (; p_Var3 != (_List_node_base *)&this->sdessources; p_Var3 = p_Var3->_M_next) {
      sVar2 = SDESSource::NeededBytes((SDESSource *)p_Var3[1]._M_next);
      lVar4 = lVar4 + sVar2;
    }
    uVar1 = (this->sdessources).
            super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ._M_impl._M_node._M_size;
    sVar2 = lVar4 + ((uVar1 / 0x1f + 1) - (ulong)(uVar1 % 0x1f == 0)) * 4;
  }
  return sVar2;
}

Assistant:

size_t NeededBytes()
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				x += (*it)->NeededBytes();
			n = sdessources.size();
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}